

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_post.c
# Opt level: O0

void nhr_request_generate_new_boundary(nhr_request r)

{
  int iVar1;
  time_t tVar2;
  char *pcVar3;
  ulong local_28;
  size_t i;
  char boundary [12];
  nhr_request r_local;
  
  boundary._4_8_ = r;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (local_28 = 0; local_28 < 0xc; local_28 = local_28 + 1) {
    iVar1 = rand();
    *(char *)((long)&i + local_28 + 4) =
         "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[iVar1 % 0x3e];
  }
  nhr_string_delete_clean((char **)(boundary._4_8_ + 0x98));
  pcVar3 = nhr_string_copy_len((char *)((long)&i + 4),0xc);
  *(char **)(boundary._4_8_ + 0x98) = pcVar3;
  return;
}

Assistant:

void nhr_request_generate_new_boundary(nhr_request r) {
    static const char charset[62] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";
    char boundary[NHR_POST_BOUNDARY_LEN];
    size_t i;
    srand((unsigned)time(NULL));
    for (i = 0; i < NHR_POST_BOUNDARY_LEN; i++) {
        boundary[i] = charset[rand() % 62];
    }
    nhr_string_delete_clean(&r->boundary);
    r->boundary = nhr_string_copy_len(boundary, NHR_POST_BOUNDARY_LEN);
}